

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O3

size_t jpgClean(uchar *data,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  uchar *puVar3;
  
  if (len == 0) {
    sVar2 = 0;
  }
  else {
    puVar3 = data + 1;
    sVar1 = 0;
    while ((puVar3[-1] != 0xff || (sVar2 = sVar1 + 1, *puVar3 != 0xd9))) {
      sVar1 = sVar1 + 1;
      puVar3 = puVar3 + 1;
      if (sVar1 == len) {
        return len;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t jpgClean(const unsigned char *data, size_t len)
{
    uint8_t EOI[2] = {0xff, 0xd9};

    for(size_t i=0; i<len; i++)
    {
        if(*data++ == EOI[0]) {
            if(*data == EOI[1]) {
                if(i+1 <= len) {
                    return (i+1);
                }
            }
        }
    }
    return len;
}